

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O2

void __thiscall
yy::mylanguage_parser::basic_symbol<yy::mylanguage_parser::by_kind>::basic_symbol
          (basic_symbol<yy::mylanguage_parser::by_kind> *this,kind_type t,string *v,location_type *l
          )

{
  filename_type *pfVar1;
  counter_type cVar2;
  counter_type cVar3;
  counter_type cVar4;
  counter_type cVar5;
  symbol_kind_type sVar6;
  
  if (t < ~TOK_YYEMPTY) {
    sVar6 = S_YYEOF;
  }
  else if ((uint)t < 0x120) {
    sVar6 = (symbol_kind_type)(char)yytranslate_(int)::translate_table[(uint)t];
  }
  else {
    sVar6 = S_YYUNDEF;
  }
  (this->super_by_kind).kind_ = sVar6;
  value_type::value_type<std::__cxx11::string>(&this->value,v);
  pfVar1 = (l->begin).filename;
  cVar4 = (l->begin).line;
  cVar5 = (l->begin).column;
  cVar2 = (l->end).line;
  cVar3 = (l->end).column;
  (this->location).end.filename = (l->end).filename;
  (this->location).end.line = cVar2;
  (this->location).end.column = cVar3;
  (this->location).begin.filename = pfVar1;
  (this->location).begin.line = cVar4;
  (this->location).begin.column = cVar5;
  return;
}

Assistant:

basic_symbol (typename Base::kind_type t, std::string&& v, location_type&& l)
        : Base (t)
        , value (std::move (v))
        , location (std::move (l))
      {}